

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost89_get_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  int iVar1;
  int iVar2;
  uchar **in;
  GOST_CIPHER_PARAMS *pGVar3;
  GOST_CIPHER_PARAMS *a;
  ASN1_TYPE *in_RSI;
  undefined8 in_RDI;
  int nid;
  ossl_gost_cipher_ctx *c;
  uchar *p;
  GOST_CIPHER_PARAMS *gcp;
  int len;
  char *in_stack_ffffffffffffffa8;
  GOST_CIPHER_PARAMS *in_stack_ffffffffffffffb0;
  ossl_gost_cipher_ctx *in_stack_ffffffffffffffb8;
  uchar *__src;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_4;
  
  in = (uchar **)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  iVar1 = ASN1_TYPE_get(in_RSI);
  if (iVar1 == 0x10) {
    pGVar3 = d2i_GOST_CIPHER_PARAMS
                       ((GOST_CIPHER_PARAMS **)((in_RSI->value).object)->ln,in,
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = pGVar3->iv->length;
    iVar2 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
    if (iVar1 == iVar2) {
      iVar1 = OBJ_obj2nid((ASN1_OBJECT *)pGVar3->enc_param_set);
      if (iVar1 == 0) {
        GOST_CIPHER_PARAMS_free(in_stack_ffffffffffffffb0);
        ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                       (int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
        local_4 = -1;
      }
      else {
        iVar1 = gost_cipher_set_param
                          (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20)
                          );
        if (iVar1 == 0) {
          GOST_CIPHER_PARAMS_free(in_stack_ffffffffffffffb0);
          local_4 = -1;
        }
        else {
          a = (GOST_CIPHER_PARAMS *)EVP_CIPHER_CTX_original_iv(in_RDI);
          __src = pGVar3->iv->data;
          iVar1 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
          memcpy(a,__src,(long)iVar1);
          GOST_CIPHER_PARAMS_free(a);
          local_4 = 1;
        }
      }
    }
    else {
      GOST_CIPHER_PARAMS_free(in_stack_ffffffffffffffb0);
      ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8,0);
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int gost89_get_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
    int len;
    GOST_CIPHER_PARAMS *gcp = NULL;
    unsigned char *p;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    int nid;

    if (ASN1_TYPE_get(params) != V_ASN1_SEQUENCE) {
        return -1;
    }

    p = params->value.sequence->data;

    gcp = d2i_GOST_CIPHER_PARAMS(NULL, (const unsigned char **)&p,
                                 params->value.sequence->length);

    len = gcp->iv->length;
    if (len != EVP_CIPHER_CTX_iv_length(ctx)) {
        GOST_CIPHER_PARAMS_free(gcp);
        GOSTerr(GOST_F_GOST89_GET_ASN1_PARAMETERS, GOST_R_INVALID_IV_LENGTH);
        return -1;
    }

    nid = OBJ_obj2nid(gcp->enc_param_set);
    if (nid == NID_undef) {
        GOST_CIPHER_PARAMS_free(gcp);
        GOSTerr(GOST_F_GOST89_GET_ASN1_PARAMETERS,
                GOST_R_INVALID_CIPHER_PARAM_OID);
        return -1;
    }

    if (!gost_cipher_set_param(c, nid)) {
        GOST_CIPHER_PARAMS_free(gcp);
        return -1;
    }
    /*XXX missing non-const accessor */
    memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), gcp->iv->data,
           EVP_CIPHER_CTX_iv_length(ctx));

    GOST_CIPHER_PARAMS_free(gcp);

    return 1;
}